

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

bool __thiscall
gss::innards::HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex
          (HomomorphismSearcher *this,uint v,uint w)

{
  bool bVar1;
  SVOBitset *pSVar2;
  SVOBitset i;
  anon_union_128_2_84168a9f_for__data local_98;
  uint local_18;
  
  pSVar2 = HomomorphismModel::pattern_graph_row(this->model,0,v);
  SVOBitset::SVOBitset((SVOBitset *)&local_98,pSVar2);
  pSVar2 = HomomorphismModel::pattern_graph_row(this->model,0,w);
  SVOBitset::operator&=((SVOBitset *)&local_98,pSVar2);
  bVar1 = SVOBitset::any((SVOBitset *)&local_98);
  if ((0x10 < local_18) && ((BitWord *)local_98.short_data[0] != (BitWord *)0x0)) {
    operator_delete__(local_98.long_data);
  }
  return bVar1;
}

Assistant:

auto HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex(unsigned v, unsigned w) -> bool
{
    auto i = model.pattern_graph_row(0, v);
    i &= model.pattern_graph_row(0, w);
    return i.any();
}